

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

dynamic_string * __thiscall crnlib::dynamic_string::set(dynamic_string *this,char *p,uint max_len)

{
  ushort uVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  size_t __n;
  
  sVar3 = strlen(p);
  __n = sVar3 & 0xffffffff;
  if (max_len < (uint)sVar3) {
    __n = (size_t)max_len;
  }
  uVar2 = (uint)__n;
  if (uVar2 - 0xffff < 0xffff0002) {
    clear(this);
  }
  else {
    __dest = this->m_pStr;
    uVar1 = this->m_buf_size;
    if (p < __dest + uVar1 && (__dest <= p && __dest != (char *)0x0)) {
      if (__dest != p) {
        memmove(__dest,p,__n);
        __dest = this->m_pStr;
      }
      __dest[__n] = '\0';
      this->m_len = (uint16)__n;
    }
    else {
      if (uVar1 <= uVar2) {
        expand_buf(this,uVar2 + 1,false);
        uVar1 = this->m_buf_size;
      }
      if (uVar2 < uVar1) {
        this->m_len = (uint16)__n;
        memcpy(this->m_pStr,p,(ulong)(uVar2 + 1));
      }
    }
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set(const char* p, uint max_len)
    {
        CRNLIB_ASSERT(p);

        const uint len = math::minimum<uint>(max_len, static_cast<uint>(strlen(p)));
        CRNLIB_ASSERT(len < cUINT16_MAX);

        if ((!len) || (len >= cUINT16_MAX))
        {
            clear();
        }
        else if ((m_pStr) && (p >= m_pStr) && (p < (m_pStr + m_buf_size)))
        {
            if (m_pStr != p)
            {
                memmove(m_pStr, p, len);
            }
            m_pStr[len] = '\0';
            m_len = static_cast<uint16>(len);
        }
        else if (ensure_buf(len, false))
        {
            m_len = static_cast<uint16>(len);
            memcpy(m_pStr, p, m_len + 1);
        }

        check();

        return *this;
    }